

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall
icu_63::RBBITableBuilder::calcChainedFollowPos(RBBITableBuilder *this,RBBINode *tree)

{
  UVector *this_00;
  int32_t iVar1;
  UChar32 c;
  void *pvVar2;
  void *obj;
  int *piVar3;
  int32_t iVar4;
  int index;
  UVector matchStartNodes;
  UVector ruleRootNodes;
  UVector leafNodes;
  UVector endMarkerNodes;
  UVector local_d0;
  UVector local_a8;
  UVector local_80;
  UVector local_58;
  
  UVector::UVector(&local_58,this->fStatus);
  UVector::UVector(&local_80,this->fStatus);
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    RBBINode::findNodes(tree,&local_58,endMark,this->fStatus);
    RBBINode::findNodes(tree,&local_80,leafChar,this->fStatus);
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      UVector::UVector(&local_a8,this->fStatus);
      addRuleRootNodes(this,&local_a8,tree);
      UVector::UVector(&local_d0,this->fStatus);
      if (0 < local_a8.count) {
        iVar4 = 0;
        do {
          pvVar2 = UVector::elementAt(&local_a8,iVar4);
          if (*(char *)((long)pvVar2 + 0x82) != '\0') {
            setAdd(this,&local_d0,*(UVector **)((long)pvVar2 + 0x88));
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < local_a8.count);
      }
      if ((*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) && (0 < local_80.count)) {
        index = 0;
        do {
          pvVar2 = UVector::elementAt(&local_80,index);
          if (0 < local_58.count) {
            iVar4 = 0;
            do {
              this_00 = *(UVector **)((long)pvVar2 + 0x98);
              obj = UVector::elementAt(&local_58,iVar4);
              iVar1 = UVector::indexOf(this_00,obj,0);
              if (-1 < iVar1) {
                if ((((this->fRB->fLBCMNoChain == '\0') ||
                     (c = RBBISetBuilder::getFirstChar
                                    (this->fRB->fSetBuilder,*(int32_t *)((long)pvVar2 + 0x7c)),
                     c == -1)) || (iVar4 = u_getIntPropertyValue_63(c,UCHAR_LINE_BREAK), iVar4 != 9)
                    ) && (0 < local_d0.count)) {
                  iVar4 = 0;
                  do {
                    piVar3 = (int *)UVector::elementAt(&local_d0,iVar4);
                    if ((*piVar3 == 3) && (*(int *)((long)pvVar2 + 0x7c) == piVar3[0x1f])) {
                      setAdd(this,*(UVector **)((long)pvVar2 + 0x98),*(UVector **)(piVar3 + 0x26));
                    }
                    iVar4 = iVar4 + 1;
                  } while (iVar4 < local_d0.count);
                }
                break;
              }
              iVar4 = iVar4 + 1;
            } while (iVar4 < local_58.count);
          }
          index = index + 1;
        } while (index < local_80.count);
      }
      UVector::~UVector(&local_d0);
      UVector::~UVector(&local_a8);
    }
  }
  UVector::~UVector(&local_80);
  UVector::~UVector(&local_58);
  return;
}

Assistant:

void RBBITableBuilder::calcChainedFollowPos(RBBINode *tree) {

    UVector         endMarkerNodes(*fStatus);
    UVector         leafNodes(*fStatus);
    int32_t         i;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // get a list of all endmarker nodes.
    tree->findNodes(&endMarkerNodes, RBBINode::endMark, *fStatus);

    // get a list all leaf nodes
    tree->findNodes(&leafNodes, RBBINode::leafChar, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }

    // Collect all leaf nodes that can start matches for rules
    // with inbound chaining enabled, which is the union of the 
    // firstPosition sets from each of the rule root nodes.
    
    UVector ruleRootNodes(*fStatus);
    addRuleRootNodes(&ruleRootNodes, tree);

    UVector matchStartNodes(*fStatus);
    for (int j=0; j<ruleRootNodes.size(); ++j) {
        RBBINode *node = static_cast<RBBINode *>(ruleRootNodes.elementAt(j));
        if (node->fChainIn) {
            setAdd(&matchStartNodes, node->fFirstPosSet);
        }
    }
    if (U_FAILURE(*fStatus)) {
        return;
    }

    int32_t  endNodeIx;
    int32_t  startNodeIx;

    for (endNodeIx=0; endNodeIx<leafNodes.size(); endNodeIx++) {
        RBBINode *tNode   = (RBBINode *)leafNodes.elementAt(endNodeIx);
        RBBINode *endNode = NULL;

        // Identify leaf nodes that correspond to overall rule match positions.
        //   These include an endMarkerNode in their followPos sets.
        for (i=0; i<endMarkerNodes.size(); i++) {
            if (tNode->fFollowPos->contains(endMarkerNodes.elementAt(i))) {
                endNode = tNode;
                break;
            }
        }
        if (endNode == NULL) {
            // node wasn't an end node.  Try again with the next.
            continue;
        }

        // We've got a node that can end a match.

        // Line Break Specific hack:  If this node's val correspond to the $CM char class,
        //                            don't chain from it.
        // TODO:  Add rule syntax for this behavior, get specifics out of here and
        //        into the rule file.
        if (fRB->fLBCMNoChain) {
            UChar32 c = this->fRB->fSetBuilder->getFirstChar(endNode->fVal);
            if (c != -1) {
                // c == -1 occurs with sets containing only the {eof} marker string.
                ULineBreak cLBProp = (ULineBreak)u_getIntPropertyValue(c, UCHAR_LINE_BREAK);
                if (cLBProp == U_LB_COMBINING_MARK) {
                    continue;
                }
            }
        }


        // Now iterate over the nodes that can start a match, looking for ones
        //   with the same char class as our ending node.
        RBBINode *startNode;
        for (startNodeIx = 0; startNodeIx<matchStartNodes.size(); startNodeIx++) {
            startNode = (RBBINode *)matchStartNodes.elementAt(startNodeIx);
            if (startNode->fType != RBBINode::leafChar) {
                continue;
            }

            if (endNode->fVal == startNode->fVal) {
                // The end val (character class) of one possible match is the
                //   same as the start of another.

                // Add all nodes from the followPos of the start node to the
                //  followPos set of the end node, which will have the effect of
                //  letting matches transition from a match state at endNode
                //  to the second char of a match starting with startNode.
                setAdd(endNode->fFollowPos, startNode->fFollowPos);
            }
        }
    }
}